

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddLin.c
# Opt level: O1

int cuddZddLinearInPlace(DdManager *table,int x,int y)

{
  DdHalfWord *pDVar1;
  DdHalfWord DVar2;
  int iVar3;
  DdHalfWord DVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  DdSubtable *pDVar8;
  DdNode **ppDVar9;
  DdNode **ppDVar10;
  DdNode *pDVar11;
  ulong uVar12;
  DdNode **ppDVar13;
  DdNode *pDVar14;
  DdNode *pDVar15;
  DdNode *pDVar16;
  byte bVar17;
  byte bVar18;
  ulong uVar19;
  DdNode **ppDVar20;
  long lVar21;
  DdNode *pDVar22;
  DdNode *pDVar23;
  uint uVar24;
  uint uVar25;
  DdNode *pDVar26;
  uint uVar27;
  DdNode *pDVar28;
  uint local_b0;
  
  zddTotalNumberLinearTr = zddTotalNumberLinearTr + 1;
  pDVar8 = table->subtableZ;
  DVar2 = table->invpermZ[x];
  ppDVar9 = pDVar8[x].nodelist;
  uVar25 = pDVar8[x].keys;
  uVar27 = pDVar8[x].slots;
  iVar3 = pDVar8[x].shift;
  DVar4 = table->invpermZ[y];
  ppDVar10 = pDVar8[y].nodelist;
  uVar5 = pDVar8[y].keys;
  uVar6 = pDVar8[y].slots;
  iVar7 = pDVar8[y].shift;
  if ((long)(int)uVar27 < 1) {
    pDVar23 = (DdNode *)0x0;
    pDVar15 = (DdNode *)0x0;
  }
  else {
    lVar21 = 0;
    pDVar15 = (DdNode *)0x0;
    pDVar23 = (DdNode *)0x0;
    do {
      pDVar22 = ppDVar9[lVar21];
      if (pDVar22 != (DdNode *)0x0) {
        ppDVar9[lVar21] = (DdNode *)0x0;
        pDVar11 = empty;
        pDVar16 = pDVar15;
        do {
          pDVar26 = pDVar22->next;
          pDVar15 = (pDVar22->type).kids.T;
          pDVar15->ref = pDVar15->ref - 1;
          pDVar14 = (pDVar22->type).kids.E;
          pDVar1 = &pDVar14->ref;
          *pDVar1 = *pDVar1 - 1;
          if (((pDVar15->index != DVar4) || ((pDVar15->type).kids.E != pDVar11)) ||
             (pDVar15 = pDVar22, pDVar14->index == DVar4)) {
            pDVar15 = pDVar16;
            pDVar16 = pDVar23;
            pDVar23 = pDVar22;
          }
          pDVar22->next = pDVar16;
          pDVar16 = pDVar15;
          pDVar22 = pDVar26;
        } while (pDVar26 != (DdNode *)0x0);
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 != (int)uVar27);
  }
  if (0 < (int)uVar6) {
    uVar19 = 0;
    do {
      for (pDVar22 = ppDVar10[uVar19]; pDVar22 != (DdNode *)0x0; pDVar22 = pDVar22->next) {
        if (pDVar22->ref != 0) {
          pDVar22->index = DVar2;
        }
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != uVar6);
  }
  bVar17 = (byte)iVar7;
  uVar27 = uVar5;
  while (pDVar15 != (DdNode *)0x0) {
    pDVar22 = pDVar15->next;
    pDVar11 = (((pDVar15->type).kids.T)->type).kids.T;
    (pDVar15->type).kids.T = pDVar11;
    pDVar11->ref = pDVar11->ref + 1;
    pDVar16 = (pDVar15->type).kids.E;
    pDVar16->ref = pDVar16->ref + 1;
    pDVar15->index = DVar4;
    uVar24 = (((uint)pDVar16 & 1) + *(int *)(((ulong)pDVar16 & 0xfffffffffffffffe) + 0x20) * 2 +
             (((uint)pDVar11 & 1) + *(int *)(((ulong)pDVar11 & 0xfffffffffffffffe) + 0x20) * 2) *
             0xc00005) * 0x40f1f9 >> (bVar17 & 0x1f);
    pDVar15->next = ppDVar10[(int)uVar24];
    ppDVar10[(int)uVar24] = pDVar15;
    uVar27 = uVar27 + 1;
    pDVar15 = pDVar22;
  }
  bVar18 = (byte)iVar3;
  if (pDVar23 == (DdNode *)0x0) {
    local_b0 = 0;
  }
  else {
    local_b0 = 0;
    do {
      pDVar15 = (pDVar23->type).kids.T;
      if (pDVar15->index == DVar2 || pDVar15->index == DVar4) {
        ppDVar13 = (DdNode **)&pDVar15->type;
        pDVar15 = (pDVar15->type).kids.E;
      }
      else {
        ppDVar13 = &empty;
      }
      pDVar22 = (pDVar23->type).kids.E;
      if (pDVar22->index == DVar2 || pDVar22->index == DVar4) {
        ppDVar20 = (DdNode **)&pDVar22->type;
        pDVar22 = (pDVar22->type).kids.E;
      }
      else {
        ppDVar20 = &empty;
      }
      pDVar11 = pDVar23->next;
      pDVar16 = ((DdChildren *)ppDVar13)->T;
      pDVar26 = ((DdChildren *)ppDVar20)->T;
      pDVar14 = pDVar15;
      pDVar28 = pDVar15;
      if (pDVar26 != empty) {
        uVar24 = (((uint)pDVar15 & 1) + *(int *)(((ulong)pDVar15 & 0xfffffffffffffffe) + 0x20) * 2 +
                 (((uint)pDVar26 & 1) + *(int *)(((ulong)pDVar26 & 0xfffffffffffffffe) + 0x20) * 2)
                 * 0xc00005) * 0x40f1f9 >> (bVar17 & 0x1f);
        for (pDVar14 = ppDVar10[(int)uVar24]; pDVar14 != (DdNode *)0x0; pDVar14 = pDVar14->next) {
          if ((((pDVar14->type).kids.T == pDVar26) && ((pDVar14->type).kids.E == pDVar15)) &&
             (pDVar28 = pDVar14, pDVar14->index == DVar4)) goto LAB_007a37c1;
        }
        pDVar14 = cuddDynamicAllocNode(table);
        if (pDVar14 == (DdNode *)0x0) {
LAB_007a3b1d:
          fwrite("Error: cuddZddSwapInPlace out of memory\n",0x28,1,(FILE *)table->err);
          return 0;
        }
        pDVar14->index = DVar4;
        pDVar14->ref = 1;
        (pDVar14->type).kids.T = pDVar26;
        (pDVar14->type).kids.E = pDVar15;
        uVar27 = uVar27 + 1;
        pDVar14->next = ppDVar10[(int)uVar24];
        ppDVar10[(int)uVar24] = pDVar14;
        pDVar26->ref = pDVar26->ref + 1;
        pDVar28 = pDVar15;
      }
LAB_007a37c1:
      pDVar28->ref = pDVar28->ref + 1;
      (pDVar23->type).kids.T = pDVar14;
      pDVar15 = pDVar22;
      pDVar26 = pDVar22;
      if (pDVar16 != empty) {
        uVar24 = (((uint)pDVar22 & 1) + *(int *)(((ulong)pDVar22 & 0xfffffffffffffffe) + 0x20) * 2 +
                 (((uint)pDVar16 & 1) + *(int *)(((ulong)pDVar16 & 0xfffffffffffffffe) + 0x20) * 2)
                 * 0xc00005) * 0x40f1f9 >> (bVar17 & 0x1f);
        for (pDVar15 = ppDVar10[(int)uVar24]; pDVar15 != (DdNode *)0x0; pDVar15 = pDVar15->next) {
          if ((((pDVar15->type).kids.T == pDVar16) && ((pDVar15->type).kids.E == pDVar22)) &&
             (pDVar26 = pDVar15, pDVar15->index == DVar4)) goto LAB_007a388f;
        }
        pDVar15 = cuddDynamicAllocNode(table);
        if (pDVar15 == (DdNode *)0x0) goto LAB_007a3b1d;
        pDVar15->index = DVar4;
        pDVar15->ref = 1;
        (pDVar15->type).kids.T = pDVar16;
        (pDVar15->type).kids.E = pDVar22;
        uVar27 = uVar27 + 1;
        pDVar15->next = ppDVar10[(int)uVar24];
        ppDVar10[(int)uVar24] = pDVar15;
        pDVar16->ref = pDVar16->ref + 1;
        pDVar26 = pDVar22;
      }
LAB_007a388f:
      pDVar26->ref = pDVar26->ref + 1;
      (pDVar23->type).kids.E = pDVar15;
      uVar24 = (((uint)pDVar15 & 1) + *(int *)(((ulong)pDVar15 & 0xfffffffffffffffe) + 0x20) * 2 +
               (((uint)pDVar14 & 1) + *(int *)(((ulong)pDVar14 & 0xfffffffffffffffe) + 0x20) * 2) *
               0xc00005) * 0x40f1f9 >> (bVar18 & 0x1f);
      local_b0 = local_b0 + 1;
      pDVar23->next = ppDVar9[(int)uVar24];
      ppDVar9[(int)uVar24] = pDVar23;
      pDVar23 = pDVar11;
    } while (pDVar11 != (DdNode *)0x0);
  }
  if (0 < (int)uVar6) {
    uVar19 = 0;
    do {
      if (ppDVar10[uVar19] != (DdNode *)0x0) {
        pDVar15 = (DdNode *)0x0;
        pDVar23 = ppDVar10[uVar19];
        do {
          pDVar22 = pDVar23->next;
          if (pDVar23->ref == 0) {
            pDVar1 = &((pDVar23->type).kids.T)->ref;
            *pDVar1 = *pDVar1 - 1;
            pDVar1 = &((pDVar23->type).kids.E)->ref;
            *pDVar1 = *pDVar1 - 1;
            pDVar23->next = table->nextFree;
            table->nextFree = pDVar23;
            uVar27 = uVar27 - 1;
            if (pDVar15 == (DdNode *)0x0) {
              ppDVar10[uVar19] = pDVar22;
              pDVar23 = (DdNode *)0x0;
            }
            else {
              pDVar15->next = pDVar22;
              pDVar23 = pDVar15;
            }
          }
          else if (pDVar23->index == DVar2) {
            ppDVar13 = &pDVar15->next;
            if (pDVar15 == (DdNode *)0x0) {
              ppDVar13 = ppDVar10 + uVar19;
            }
            *ppDVar13 = pDVar22;
            pDVar11 = (pDVar23->type).kids.T;
            pDVar11->ref = pDVar11->ref - 1;
            uVar24 = (((uint)empty & 1) + *(int *)(((ulong)empty & 0xfffffffffffffffe) + 0x20) * 2 +
                     (((uint)pDVar11 & 1) +
                     *(int *)(((ulong)pDVar11 & 0xfffffffffffffffe) + 0x20) * 2) * 0xc00005) *
                     0x40f1f9 >> (bVar17 & 0x1f);
            for (pDVar16 = ppDVar10[(int)uVar24]; pDVar16 != (DdNode *)0x0; pDVar16 = pDVar16->next)
            {
              if ((((pDVar16->type).kids.T == pDVar11) && ((pDVar16->type).kids.E == empty)) &&
                 (pDVar16->index == DVar4)) {
                pDVar16->ref = pDVar16->ref + 1;
                uVar27 = uVar27 - 1;
                goto LAB_007a3a93;
              }
            }
            pDVar16 = cuddDynamicAllocNode(table);
            if (pDVar16 == (DdNode *)0x0) goto LAB_007a3b1d;
            pDVar16->index = DVar4;
            pDVar16->ref = 1;
            (pDVar16->type).kids.T = pDVar11;
            (pDVar16->type).kids.E = empty;
            pDVar16->next = ppDVar10[(int)uVar24];
            if (uVar24 == uVar19 && pDVar15 == (DdNode *)0x0) {
              pDVar15 = pDVar16;
            }
            ppDVar10[(int)uVar24] = pDVar16;
            pDVar11->ref = pDVar11->ref + 1;
            empty->ref = empty->ref + 1;
LAB_007a3a93:
            (pDVar23->type).kids.T = pDVar16;
            uVar12 = *(ulong *)((long)&pDVar23->type + 8);
            uVar24 = (((uint)uVar12 & 1) + *(int *)((uVar12 & 0xfffffffffffffffe) + 0x20) * 2 +
                     (((uint)pDVar16 & 1) +
                     *(int *)(((ulong)pDVar16 & 0xfffffffffffffffe) + 0x20) * 2) * 0xc00005) *
                     0x40f1f9 >> (bVar18 & 0x1f);
            local_b0 = local_b0 + 1;
            pDVar23->next = ppDVar9[(int)uVar24];
            ppDVar9[(int)uVar24] = pDVar23;
            pDVar23 = pDVar15;
          }
          pDVar15 = pDVar23;
          pDVar23 = pDVar22;
        } while (pDVar22 != (DdNode *)0x0);
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != uVar6);
  }
  pDVar8 = table->subtableZ;
  pDVar8[x].keys = local_b0;
  pDVar8[y].keys = uVar27;
  uVar25 = (local_b0 - (uVar5 + uVar25)) + uVar27 + table->keysZ;
  table->keysZ = uVar25;
  table->univ[y] = (DdNode *)(table->univ[x]->type).value;
  return uVar25;
}

Assistant:

static int
cuddZddLinearInPlace(
  DdManager * table,
  int  x,
  int  y)
{
    DdNodePtr *xlist, *ylist;
    int         xindex, yindex;
    int         xslots, yslots;
    int         xshift, yshift;
    int         oldxkeys, oldykeys;
    int         newxkeys, newykeys;
    int         i;
    int         posn;
    DdNode      *f, *f1, *f0, *f11, *f10, *f01, *f00;
    DdNode      *newf1, *newf0, *g, *next, *previous;
    DdNode      *special;

#ifdef DD_DEBUG
    assert(x < y);
    assert(cuddZddNextHigh(table,x) == y);
    assert(table->subtableZ[x].keys != 0);
    assert(table->subtableZ[y].keys != 0);
    assert(table->subtableZ[x].dead == 0);
    assert(table->subtableZ[y].dead == 0);
#endif

    zddTotalNumberLinearTr++;

    /* Get parameters of x subtable. */
    xindex   = table->invpermZ[x];
    xlist    = table->subtableZ[x].nodelist;
    oldxkeys = table->subtableZ[x].keys;
    xslots   = table->subtableZ[x].slots;
    xshift   = table->subtableZ[x].shift;
    newxkeys = 0;

    /* Get parameters of y subtable. */
    yindex   = table->invpermZ[y];
    ylist    = table->subtableZ[y].nodelist;
    oldykeys = table->subtableZ[y].keys;
    yslots   = table->subtableZ[y].slots;
    yshift   = table->subtableZ[y].shift;
    newykeys = oldykeys;

    /* The nodes in the x layer are put in two chains.  The chain
    ** pointed by g holds the normal nodes. When re-expressed they stay
    ** in the x list. The chain pointed by special holds the elements
    ** that will move to the y list.
    */
    g = special = NULL;
    for (i = 0; i < xslots; i++) {
        f = xlist[i];
        if (f == NULL) continue;
        xlist[i] = NULL;
        while (f != NULL) {
            next = f->next;
            f1 = cuddT(f);
            /* if (f1->index == yindex) */ cuddSatDec(f1->ref);
            f0 = cuddE(f);
            /* if (f0->index == yindex) */ cuddSatDec(f0->ref);
            if ((int) f1->index == yindex && cuddE(f1) == empty &&
                (int) f0->index != yindex) {
                f->next = special;
                special = f;
            } else {
                f->next = g;
                g = f;
            }
            f = next;
        } /* while there are elements in the collision chain */
    } /* for each slot of the x subtable */

    /* Mark y nodes with pointers from above x. We mark them by
    **  changing their index to x.
    */
    for (i = 0; i < yslots; i++) {
        f = ylist[i];
        while (f != NULL) {
            if (f->ref != 0) {
                f->index = xindex;
            }
            f = f->next;
        } /* while there are elements in the collision chain */
    } /* for each slot of the y subtable */

    /* Move special nodes to the y list. */
    f = special;
    while (f != NULL) {
        next = f->next;
        f1 = cuddT(f);
        f11 = cuddT(f1);
        cuddT(f) = f11;
        cuddSatInc(f11->ref);
        f0 = cuddE(f);
        cuddSatInc(f0->ref);
        f->index = yindex;
        /* Insert at the beginning of the list so that it will be
        ** found first if there is a duplicate. The duplicate will
        ** eventually be moved or garbage collected. No node
        ** re-expression will add a pointer to it.
        */
        posn = ddHash(cuddF2L(f11), cuddF2L(f0), yshift);
        f->next = ylist[posn];
        ylist[posn] = f;
        newykeys++;
        f = next;
    }

    /* Take care of the remaining x nodes that must be re-expressed.
    ** They form a linked list pointed by g.
    */
    f = g;
    while (f != NULL) {
#ifdef DD_COUNT
        table->swapSteps++;
#endif
        next = f->next;
        /* Find f1, f0, f11, f10, f01, f00. */
        f1 = cuddT(f);
        if ((int) f1->index == yindex || (int) f1->index == xindex) {
            f11 = cuddT(f1); f10 = cuddE(f1);
        } else {
            f11 = empty; f10 = f1;
        }
        f0 = cuddE(f);
        if ((int) f0->index == yindex || (int) f0->index == xindex) {
            f01 = cuddT(f0); f00 = cuddE(f0);
        } else {
            f01 = empty; f00 = f0;
        }
        /* Create the new T child. */
        if (f01 == empty) {
            newf1 = f10;
            cuddSatInc(newf1->ref);
        } else {
            /* Check ylist for triple (yindex, f01, f10). */
            posn = ddHash(cuddF2L(f01), cuddF2L(f10), yshift);
            /* For each element newf1 in collision list ylist[posn]. */
            newf1 = ylist[posn];
            /* Search the collision chain skipping the marked nodes. */
            while (newf1 != NULL) {
                if (cuddT(newf1) == f01 && cuddE(newf1) == f10 &&
                    (int) newf1->index == yindex) {
                    cuddSatInc(newf1->ref);
                    break; /* match */
                }
                newf1 = newf1->next;
            } /* while newf1 */
            if (newf1 == NULL) {        /* no match */
                newf1 = cuddDynamicAllocNode(table);
                if (newf1 == NULL)
                    goto zddSwapOutOfMem;
                newf1->index = yindex; newf1->ref = 1;
                cuddT(newf1) = f01;
                cuddE(newf1) = f10;
                /* Insert newf1 in the collision list ylist[pos];
                ** increase the ref counts of f01 and f10
                */
                newykeys++;
                newf1->next = ylist[posn];
                ylist[posn] = newf1;
                cuddSatInc(f01->ref);
                cuddSatInc(f10->ref);
            }
        }
        cuddT(f) = newf1;

        /* Do the same for f0. */
        /* Create the new E child. */
        if (f11 == empty) {
            newf0 = f00;
            cuddSatInc(newf0->ref);
        } else {
            /* Check ylist for triple (yindex, f11, f00). */
            posn = ddHash(cuddF2L(f11), cuddF2L(f00), yshift);
            /* For each element newf0 in collision list ylist[posn]. */
            newf0 = ylist[posn];
            while (newf0 != NULL) {
                if (cuddT(newf0) == f11 && cuddE(newf0) == f00 &&
                    (int) newf0->index == yindex) {
                    cuddSatInc(newf0->ref);
                    break; /* match */
                }
                newf0 = newf0->next;
            } /* while newf0 */
            if (newf0 == NULL) {        /* no match */
                newf0 = cuddDynamicAllocNode(table);
                if (newf0 == NULL)
                    goto zddSwapOutOfMem;
                newf0->index = yindex; newf0->ref = 1;
                cuddT(newf0) = f11; cuddE(newf0) = f00;
                /* Insert newf0 in the collision list ylist[posn];
                ** increase the ref counts of f11 and f00.
                */
                newykeys++;
                newf0->next = ylist[posn];
                ylist[posn] = newf0;
                cuddSatInc(f11->ref);
                cuddSatInc(f00->ref);
            }
        }
        cuddE(f) = newf0;

        /* Re-insert the modified f in xlist.
        ** The modified f does not already exists in xlist.
        ** (Because of the uniqueness of the cofactors.)
        */
        posn = ddHash(cuddF2L(newf1), cuddF2L(newf0), xshift);
        newxkeys++;
        f->next = xlist[posn];
        xlist[posn] = f;
        f = next;
    } /* while f != NULL */

    /* GC the y layer and move the marked nodes to the x list. */

    /* For each node f in ylist. */
    for (i = 0; i < yslots; i++) {
        previous = NULL;
        f = ylist[i];
        while (f != NULL) {
            next = f->next;
            if (f->ref == 0) {
                cuddSatDec(cuddT(f)->ref);
                cuddSatDec(cuddE(f)->ref);
                cuddDeallocNode(table, f);
                newykeys--;
                if (previous == NULL)
                    ylist[i] = next;
                else
                    previous->next = next;
            } else if ((int) f->index == xindex) { /* move marked node */
                if (previous == NULL)
                    ylist[i] = next;
                else
                    previous->next = next;
                f1 = cuddT(f);
                cuddSatDec(f1->ref);
                /* Check ylist for triple (yindex, f1, empty). */
                posn = ddHash(cuddF2L(f1), cuddF2L(empty), yshift);
                /* For each element newf1 in collision list ylist[posn]. */
                newf1 = ylist[posn];
                while (newf1 != NULL) {
                    if (cuddT(newf1) == f1 && cuddE(newf1) == empty &&
                        (int) newf1->index == yindex) {
                        cuddSatInc(newf1->ref);
                        break; /* match */
                    }
                    newf1 = newf1->next;
                } /* while newf1 */
                if (newf1 == NULL) {    /* no match */
                    newf1 = cuddDynamicAllocNode(table);
                    if (newf1 == NULL)
                        goto zddSwapOutOfMem;
                    newf1->index = yindex; newf1->ref = 1;
                    cuddT(newf1) = f1; cuddE(newf1) = empty;
                    /* Insert newf1 in the collision list ylist[posn];
                    ** increase the ref counts of f1 and empty.
                    */
                    newykeys++;
                    newf1->next = ylist[posn];
                    ylist[posn] = newf1;
                    if (posn == i && previous == NULL)
                        previous = newf1;
                    cuddSatInc(f1->ref);
                    cuddSatInc(empty->ref);
                }
                cuddT(f) = newf1;
                f0 = cuddE(f);
                /* Insert f in x list. */
                posn = ddHash(cuddF2L(newf1), cuddF2L(f0), xshift);
                newxkeys++;
                newykeys--;
                f->next = xlist[posn];
                xlist[posn] = f;
            } else {
                previous = f;
            }
            f = next;
        } /* while f */
    } /* for i */

    /* Set the appropriate fields in table. */
    table->subtableZ[x].keys     = newxkeys;
    table->subtableZ[y].keys     = newykeys;

    table->keysZ += newxkeys + newykeys - oldxkeys - oldykeys;

    /* Update univ section; univ[x] remains the same. */
    table->univ[y] = cuddT(table->univ[x]);

#if 0
    (void) fprintf(table->out,"x = %d  y = %d\n", x, y);
    (void) Cudd_DebugCheck(table);
    (void) Cudd_CheckKeys(table);
#endif

    return (table->keysZ);

zddSwapOutOfMem:
    (void) fprintf(table->err, "Error: cuddZddSwapInPlace out of memory\n");

    return (0);

}